

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.cpp
# Opt level: O0

void de::anon_unknown_1::runAppendListTest
               (deUint32 numThreads,deUint32 numElements,deUint32 numElementsHint)

{
  deBool dVar1;
  TestThread *pTVar2;
  reference pvVar3;
  size_t sVar4;
  iterator __first;
  iterator __last;
  TestElem *pTVar5;
  reference pvVar6;
  bool bVar7;
  bool local_19d;
  uint local_13c;
  deUint32 threadNdx_2;
  TestElem *elem;
  Iterator<const_de::(anonymous_namespace)::TestElem> local_118;
  iterator local_100;
  undefined1 local_e8 [8];
  const_iterator elemIter;
  allocator<unsigned_int> local_b1;
  undefined1 local_b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> countByThread;
  undefined1 local_90 [4];
  deUint32 threadNdx_1;
  uint local_80;
  deUint32 threadNdx;
  allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_> local_69;
  undefined1 local_68 [8];
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  threads;
  SharedState sharedState;
  deUint32 numElementsHint_local;
  deUint32 numElements_local;
  deUint32 numThreads_local;
  
  sharedState.testList.m_last._4_4_ = numElementsHint;
  SharedState::SharedState
            ((SharedState *)
             &threads.
              super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,numThreads,numElements,
             numElementsHint);
  std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>::allocator(&local_69);
  std::
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ::vector((vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
            *)local_68,(ulong)numThreads,&local_69);
  std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>::~allocator(&local_69);
  for (local_80 = 0; local_80 < numThreads; local_80 = local_80 + 1) {
    pTVar2 = (TestThread *)operator_new(0x28);
    TestThread::TestThread
              (pTVar2,(SharedState *)
                      &threads.
                       super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_80);
    SharedPtr<de::(anonymous_namespace)::TestThread>::SharedPtr
              ((SharedPtr<de::(anonymous_namespace)::TestThread> *)local_90,pTVar2);
    pvVar3 = std::
             vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
             ::operator[]((vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                           *)local_68,(ulong)local_80);
    SharedPtr<de::(anonymous_namespace)::TestThread>::operator=
              (pvVar3,(SharedPtr<de::(anonymous_namespace)::TestThread> *)local_90);
    SharedPtr<de::(anonymous_namespace)::TestThread>::~SharedPtr
              ((SharedPtr<de::(anonymous_namespace)::TestThread> *)local_90);
    pvVar3 = std::
             vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
             ::operator[]((vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                           *)local_68,(ulong)local_80);
    pTVar2 = SharedPtr<de::(anonymous_namespace)::TestThread>::operator->(pvVar3);
    Thread::start(&pTVar2->super_Thread);
  }
  for (countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < numThreads;
      countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar3 = std::
             vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
             ::operator[]((vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                           *)local_68,
                          (ulong)countByThread.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    pTVar2 = SharedPtr<de::(anonymous_namespace)::TestThread>::operator->(pvVar3);
    Thread::join(&pTVar2->super_Thread);
  }
  do {
    dVar1 = ::deGetFalse();
    bVar7 = false;
    if (dVar1 == 0) {
      sVar4 = AppendList<de::(anonymous_namespace)::TestElem>::size
                        ((AppendList<de::(anonymous_namespace)::TestElem> *)
                         &sharedState.barrier.m_numLeaving);
      bVar7 = sVar4 == (ulong)numElements * (ulong)numThreads;
    }
    if (!bVar7) {
      deAssertFail("sharedState.testList.size() == (size_t)numElements*(size_t)numThreads",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                   ,0x6f);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::allocator<unsigned_int>::allocator(&local_b1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,(ulong)numThreads,
             &local_b1);
  std::allocator<unsigned_int>::~allocator(&local_b1);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
  elemIter.m_slotNdx._4_4_ = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current,(int *)((long)&elemIter.m_slotNdx + 4));
  AppendList<de::(anonymous_namespace)::TestElem>::begin
            (&local_100,
             (AppendList<de::(anonymous_namespace)::TestElem> *)&sharedState.barrier.m_numLeaving);
  AppendList::Iterator::operator_cast_to_Iterator
            ((Iterator<const_de::(anonymous_namespace)::TestElem> *)local_e8,(Iterator *)&local_100)
  ;
  while( true ) {
    AppendList<de::(anonymous_namespace)::TestElem>::end
              ((iterator *)&elem,
               (AppendList<de::(anonymous_namespace)::TestElem> *)&sharedState.barrier.m_numLeaving)
    ;
    AppendList::Iterator::operator_cast_to_Iterator(&local_118,(Iterator *)&elem);
    bVar7 = AppendList<de::(anonymous_namespace)::TestElem>::
            Iterator<const_de::(anonymous_namespace)::TestElem>::operator!=
                      ((Iterator<const_de::(anonymous_namespace)::TestElem> *)local_e8,&local_118);
    if (!bVar7) break;
    pTVar5 = AppendList<de::(anonymous_namespace)::TestElem>::
             Iterator<const_de::(anonymous_namespace)::TestElem>::operator*
                       ((Iterator<const_de::(anonymous_namespace)::TestElem> *)local_e8);
    do {
      dVar1 = ::deGetFalse();
      local_19d = false;
      if (dVar1 == 0) {
        local_19d = inBounds<unsigned_int>(pTVar5->threadNdx,0,numThreads);
      }
      if (local_19d == false) {
        deAssertFail("de::inBounds(elem.threadNdx, 0u, numThreads)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x7c);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      dVar1 = ::deGetFalse();
      bVar7 = false;
      if (dVar1 == 0) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,
                            (ulong)pTVar5->threadNdx);
        bVar7 = *pvVar6 == pTVar5->elemNdx;
      }
      if (!bVar7) {
        deAssertFail("countByThread[elem.threadNdx] == elem.elemNdx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x7d);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,
                        (ulong)pTVar5->threadNdx);
    *pvVar6 = *pvVar6 + 1;
    AppendList<de::(anonymous_namespace)::TestElem>::
    Iterator<const_de::(anonymous_namespace)::TestElem>::operator++
              ((Iterator<const_de::(anonymous_namespace)::TestElem> *)local_e8);
  }
  for (local_13c = 0; local_13c < numThreads; local_13c = local_13c + 1) {
    do {
      dVar1 = ::deGetFalse();
      bVar7 = false;
      if (dVar1 == 0) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,
                            (ulong)local_13c);
        bVar7 = *pvVar6 == numElements;
      }
      if (!bVar7) {
        deAssertFail("countByThread[threadNdx] == numElements",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x83);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
  std::
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ::~vector((vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
             *)local_68);
  SharedState::~SharedState
            ((SharedState *)
             &threads.
              super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void runAppendListTest (deUint32 numThreads, deUint32 numElements, deUint32 numElementsHint)
{
	SharedState				sharedState		(numThreads, numElements, numElementsHint);
	vector<TestThreadSp>	threads			(numThreads);

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
	{
		threads[threadNdx] = TestThreadSp(new TestThread(&sharedState, threadNdx));
		threads[threadNdx]->start();
	}

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
		threads[threadNdx]->join();

	DE_TEST_ASSERT(sharedState.testList.size() == (size_t)numElements*(size_t)numThreads);

	{
		vector<deUint32>	countByThread	(numThreads);

		std::fill(countByThread.begin(), countByThread.end(), 0);

		for (AppendList<TestElem>::const_iterator elemIter = sharedState.testList.begin();
			 elemIter != sharedState.testList.end();
			 ++elemIter)
		{
			const TestElem&	elem	= *elemIter;

			DE_TEST_ASSERT(de::inBounds(elem.threadNdx, 0u, numThreads));
			DE_TEST_ASSERT(countByThread[elem.threadNdx] == elem.elemNdx);

			countByThread[elem.threadNdx] += 1;
		}

		for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
			DE_TEST_ASSERT(countByThread[threadNdx] == numElements);
	}
}